

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O2

void yy_2_use_stmt(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *node;
  PVIPNode *pPVar1;
  PVIPNode *n2;
  PVIPParserContext *parser;
  
  node = G->ss;
  parser = &G->data;
  pPVar1 = PVIP_node_new_string(parser,PVIP_NODE_STRING,"ver",3);
  n2 = PVIP_node_new_string(parser,PVIP_NODE_STRING,yytext,(long)yyleng);
  pPVar1 = PVIP_node_new_children2(parser,PVIP_NODE_PAIR,pPVar1,n2);
  PVIP_node_push_child(node,pPVar1);
  return;
}

Assistant:

YY_ACTION(void) yy_2_use_stmt(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define pkg G->val[-1]
  yyprintf((stderr, "do yy_2_use_stmt"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {\n\
            PVIP_node_push_child(yy,\n\
                PVIP_node_new_children2(&(G->data), PVIP_NODE_PAIR,\n\
                    PVIP_node_new_string(&(G->data), PVIP_NODE_STRING, \"ver\", 3),\n\
                    PVIP_node_new_string(&(G->data), PVIP_NODE_STRING, yytext, yyleng)\n\
                )\n\
            );\n\
        }\n"));
  
            PVIP_node_push_child(yy,
                PVIP_node_new_children2(&(G->data), PVIP_NODE_PAIR,
                    PVIP_node_new_string(&(G->data), PVIP_NODE_STRING, "ver", 3),
                    PVIP_node_new_string(&(G->data), PVIP_NODE_STRING, yytext, yyleng)
                )
            );
        ;
#undef pkg
}